

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

Instr * __thiscall Lowerer::LowerFrameDisplayCheck(Lowerer *this,Instr *instr)

{
  uint uVar1;
  Instr *pIVar2;
  _func_int **pp_Var3;
  RegOpnd *baseOpnd;
  SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  code *pcVar5;
  Instr *pIVar6;
  LabelInstr *instr_00;
  OpndKind OVar7;
  bool bVar8;
  Opnd *this_00;
  undefined4 *puVar9;
  Type *pTVar10;
  LabelInstr *target;
  IndirOpnd *pIVar11;
  RegOpnd *baseOpnd_00;
  IntConstOpnd *pIVar12;
  Instr *instr_01;
  ulong uVar13;
  _func_int *p_Var14;
  Lowerer *pLVar15;
  Iterator local_50;
  Instr *local_40;
  LabelInstr *local_38;
  
  local_40 = instr->m_next;
  pIVar2 = instr->m_prev;
  this_00 = IR::Instr::UnlinkSrc2(instr);
  OVar7 = IR::Opnd::GetKind(this_00);
  if (OVar7 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar8) goto LAB_005c0328;
    *puVar9 = 0;
  }
  pp_Var3 = this_00[2]._vptr_Opnd;
  baseOpnd = (RegOpnd *)instr->m_dst;
  OVar7 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar7 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar9 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar8) {
LAB_005c0328:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  if (*(int *)(pp_Var3 + 1) + 1U < 3) {
    local_38 = (LabelInstr *)0x0;
    target = (LabelInstr *)0x0;
  }
  else {
    target = IR::LabelInstr::New(Label,this->m_func,true);
    local_38 = IR::LabelInstr::New(Label,this->m_func,false);
    pIVar11 = IR::IndirOpnd::New(baseOpnd,2,TyUint16,this->m_func,true);
    pLVar15 = (Lowerer *)(ulong)(*(int *)(pp_Var3 + 1) - 1);
    pIVar12 = IR::IntConstOpnd::New((IntConstType)pLVar15,TyUint16,this->m_func,false);
    InsertCompareBranch(pLVar15,&pIVar11->super_Opnd,&pIVar12->super_Opnd,BrLe_A,true,target,
                        local_40,false);
  }
  p_Var14 = *pp_Var3;
  if ((p_Var14 != (_func_int *)0x0) && (*(int *)(p_Var14 + 8) != 0)) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar13 = 0;
    do {
      local_50.list =
           (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
           (uVar13 * 0x10 + *(long *)(p_Var14 + 0x10));
      local_50.current = (NodeBase *)local_50.list;
      while( true ) {
        if ((SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)local_50.current
            == (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_005c0328;
          *puVar9 = 0;
        }
        pSVar4 = (SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount> *)
                 ((SListNodeBase<Memory::ArenaAllocator> *)&(local_50.current)->next)->next;
        if (pSVar4 == local_50.list) break;
        local_50.current = (NodeBase *)pSVar4;
        pTVar10 = SListBase<Bucket<unsigned_int>,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            (&local_50);
        uVar1 = pTVar10->element;
        if (uVar1 - 3 < 0xfffffffc) {
          if (target == (LabelInstr *)0x0) {
            target = IR::LabelInstr::New(Label,this->m_func,true);
            local_38 = IR::LabelInstr::New(Label,this->m_func,false);
          }
          pIVar11 = IR::IndirOpnd::New(baseOpnd,pTVar10->value << 3,TyVar,this->m_func,true);
          baseOpnd_00 = IR::RegOpnd::New(TyVar,this->m_func);
          pIVar6 = local_40;
          InsertMove(&baseOpnd_00->super_Opnd,&pIVar11->super_Opnd,local_40,true);
          pIVar11 = IR::IndirOpnd::New(baseOpnd_00,0,TyVar,this->m_func,true);
          pLVar15 = (Lowerer *)(ulong)(uVar1 - 2);
          pIVar12 = IR::IntConstOpnd::New((IntConstType)pLVar15,TyUint32,this->m_func,false);
          InsertCompareBranch(pLVar15,&pIVar11->super_Opnd,&pIVar12->super_Opnd,BrLe_A,true,target,
                              pIVar6,false);
        }
      }
      uVar13 = uVar13 + 1;
      p_Var14 = *pp_Var3;
    } while (uVar13 < *(uint *)(p_Var14 + 8));
  }
  instr_00 = local_38;
  pIVar6 = local_40;
  if (target != (LabelInstr *)0x0) {
    InsertBranch(Br,false,local_38,local_40);
    IR::Instr::InsertBefore(pIVar6,&target->super_Instr);
    instr_01 = IR::Instr::New(Call,this->m_func);
    IR::Instr::InsertBefore(pIVar6,instr_01);
    LowererMD::ChangeToHelperCall
              (&this->m_lowererMD,instr_01,HelperOp_FatalInternalError,(LabelInstr *)0x0,(Opnd *)0x0
               ,(PropertySymOpnd *)0x0,false);
    IR::Instr::InsertBefore(pIVar6,&instr_00->super_Instr);
  }
  LowererMD::ChangeToAssign(instr);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerFrameDisplayCheck(IR::Instr * instr)
{
    IR::Instr *instrPrev = instr->m_prev;
    IR::Instr *insertInstr = instr->m_next;
    IR::AddrOpnd *addrOpnd = instr->UnlinkSrc2()->AsAddrOpnd();
    FrameDisplayCheckRecord *record = (FrameDisplayCheckRecord*)addrOpnd->m_address;

    IR::LabelInstr *errorLabel = nullptr;
    IR::LabelInstr *continueLabel = nullptr;
    IR::RegOpnd *envOpnd = instr->GetDst()->AsRegOpnd();
    uint32 frameDisplayOffset = Js::FrameDisplay::GetOffsetOfScopes()/sizeof(Js::Var);

    if (record->slotId != (uint32)-1 && record->slotId > frameDisplayOffset)
    {
        // Check that the frame display has enough scopes in it to satisfy the code.
        errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                       Js::FrameDisplay::GetOffsetOfLength(),
                                                       TyUint16, m_func, true);

        IR::IntConstOpnd *slotIdOpnd = IR::IntConstOpnd::New(record->slotId - frameDisplayOffset, TyUint16, m_func);
        InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
    }

    if (record->table)
    {
        // Check the size of each of the slot arrays in the scope chain.
        FOREACH_HASHTABLE_ENTRY(uint32, bucket, record->table)
        {
            uint32 slotId = bucket.element;
            if (slotId != (uint32)-1 && slotId > Js::ScopeSlots::FirstSlotIndex)
            {
                if (errorLabel == nullptr)
                {
                    errorLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
                    continueLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
                }

                IR::IndirOpnd * indirOpnd = IR::IndirOpnd::New(envOpnd,
                                                               bucket.value * sizeof(Js::Var),
                                                               TyVar, m_func, true);
                IR::RegOpnd * slotArrayOpnd = IR::RegOpnd::New(TyVar, m_func);
                InsertMove(slotArrayOpnd, indirOpnd, insertInstr);

                indirOpnd = IR::IndirOpnd::New(slotArrayOpnd,
                                               Js::ScopeSlots::EncodedSlotCountSlotIndex * sizeof(Js::Var),
                                               TyVar, m_func, true);

                IR::IntConstOpnd * slotIdOpnd = IR::IntConstOpnd::New(slotId - Js::ScopeSlots::FirstSlotIndex,
                                                                      TyUint32, m_func);
                InsertCompareBranch(indirOpnd, slotIdOpnd, Js::OpCode::BrLe_A, true, errorLabel, insertInstr);
            }
        }
        NEXT_HASHTABLE_ENTRY;
    }

    if (errorLabel)
    {
        InsertBranch(Js::OpCode::Br, continueLabel, insertInstr);

        insertInstr->InsertBefore(errorLabel);
        IR::Instr * instrHelper = IR::Instr::New(Js::OpCode::Call, m_func);
        insertInstr->InsertBefore(instrHelper);
        m_lowererMD.ChangeToHelperCall(instrHelper, IR::HelperOp_FatalInternalError);
        insertInstr->InsertBefore(continueLabel);
    }

    m_lowererMD.ChangeToAssign(instr);

    return instrPrev;
}